

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

ROMImage * MT32Emu::ROMImage::interleaveImages(ROMImage *romImageEven,ROMImage *romImageOdd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Bit8u *data;
  ROMImage *romImage;
  long lVar5;
  long lVar4;
  
  iVar1 = (*romImageEven->file->_vptr_File[3])();
  iVar2 = (*romImageOdd->file->_vptr_File[3])();
  iVar3 = (*romImageEven->file->_vptr_File[2])();
  lVar4 = CONCAT44(extraout_var_01,iVar3);
  data = (Bit8u *)operator_new__(lVar4 * 2);
  if (lVar4 != 0) {
    lVar5 = 0;
    do {
      data[lVar5 * 2] = *(Bit8u *)(CONCAT44(extraout_var,iVar1) + lVar5);
      data[lVar5 * 2 + 1] = *(Bit8u *)(CONCAT44(extraout_var_00,iVar2) + lVar5);
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  romImage = makeFullROMImage(data,lVar4 * 2);
  if (romImage->romInfo == (ROMInfo *)0x0) {
    freeROMImage(romImage);
    romImage = (ROMImage *)0x0;
  }
  return romImage;
}

Assistant:

const ROMImage *ROMImage::interleaveImages(const ROMImage *romImageEven, const ROMImage *romImageOdd) {
	const Bit8u *romDataEven = romImageEven->getFile()->getData();
	const Bit8u *romDataOdd = romImageOdd->getFile()->getData();
	size_t partSize = romImageEven->getFile()->getSize();
	Bit8u *data = new Bit8u[2 * partSize];
	Bit8u *writePtr = data;
	for (size_t romDataIx = 0; romDataIx < partSize; romDataIx++) {
		*(writePtr++) = romDataEven[romDataIx];
		*(writePtr++) = romDataOdd[romDataIx];
	}
	const ROMImage *romImageFull = makeFullROMImage(data, 2 * partSize);
	if (romImageFull->getROMInfo() == NULL) {
		freeROMImage(romImageFull);
		return NULL;
	}
	return romImageFull;
}